

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voting.cpp
# Opt level: O2

void __thiscall CVoting::CallvoteSpectate(CVoting *this,int ClientID,char *pReason,bool ForceVote)

{
  long lVar1;
  long in_FS_OFFSET;
  char aBuf [32];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  str_format(aBuf,0x20,"%d",ClientID);
  Callvote(this,"spectate",aBuf,pReason,ForceVote);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CVoting::CallvoteSpectate(int ClientID, const char *pReason, bool ForceVote)
{
	char aBuf[32];
	str_format(aBuf, sizeof(aBuf), "%d", ClientID);
	Callvote("spectate", aBuf, pReason, ForceVote);
}